

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O2

bool __thiscall GMESong::GetTrackInfo(GMESong *this)

{
  gme_err_t pcVar1;
  
  if (this->TrackInfo != (gme_info_t *)0x0) {
    gme_free_info(this->TrackInfo);
    this->TrackInfo = (gme_info_t *)0x0;
  }
  pcVar1 = gme_track_info(this->Emu,&this->TrackInfo,this->CurrTrack);
  if (pcVar1 != (gme_err_t)0x0) {
    Printf("Could not get track %d info: %s\n",(ulong)(uint)this->CurrTrack,pcVar1);
  }
  return pcVar1 == (gme_err_t)0x0;
}

Assistant:

bool GMESong::GetTrackInfo()
{
	gme_err_t err;

	if (TrackInfo != NULL)
	{
		gme_free_info(TrackInfo);
		TrackInfo = NULL;
	}
	err = gme_track_info(Emu, &TrackInfo, CurrTrack);
	if (err != NULL)
	{
		Printf("Could not get track %d info: %s\n", CurrTrack, err);
		return false;
	}
	return true;
}